

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLink.h
# Opt level: O2

ChCoordsys<double> * __thiscall
chrono::ChLink::GetLinkRelativeCoords(ChCoordsys<double> *__return_storage_ptr__,ChLink *this)

{
  ChCoordsys<double>::ChCoordsys(__return_storage_ptr__,(ChCoordsys<double> *)CSYSNORM);
  return __return_storage_ptr__;
}

Assistant:

virtual ChCoordsys<> GetLinkRelativeCoords() { return CSYSNORM; }